

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O3

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,VariableExpression *expression)

{
  pointer pcVar1;
  NewScopeLayer *pNVar2;
  bool bVar3;
  NewScopeLayer *this_00;
  mapped_type *pmVar4;
  string local_a0;
  Symbol local_80;
  string local_60;
  Symbol local_40;
  
  pcVar1 = (expression->variable_name_)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (expression->variable_name_)._M_string_length);
  Symbol::Symbol(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pNVar2 = this->current_layer_;
  while( true ) {
    this_00 = pNVar2;
    bVar3 = NewScopeLayer::HasArray(this_00,&local_40);
    if (bVar3) break;
    bVar3 = NewScopeLayer::HasVariable(this_00,&local_40);
    if ((bVar3) || (pNVar2 = this_00->parent_, this_00->parent_->parent_ == (NewScopeLayer *)0x0))
    break;
  }
  pcVar1 = (expression->variable_name_)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (expression->variable_name_)._M_string_length);
  Symbol::Symbol(&local_80,&local_a0);
  pmVar4 = std::__detail::
           _Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this_00->symbol_types_,&local_80);
  (this->super_TemplateVisitor<int>).tos_value_ = *pmVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name_._M_dataplus._M_p != &local_80.name_.field_2) {
    operator_delete(local_80.name_._M_dataplus._M_p,local_80.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name_._M_dataplus._M_p != &local_40.name_.field_2) {
    operator_delete(local_40.name_._M_dataplus._M_p,local_40.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(VariableExpression* expression) {
  // can be arr or var
  const Symbol& symbol = Symbol(expression->variable_name_);
  NewScopeLayer* current = current_layer_;

  while (!current->HasArray(symbol) && !current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  tos_value_ = current->symbol_types_[Symbol(expression->variable_name_)];
}